

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int heap_add_entry(archive_read *a,heap_queue *heap,file_info *file,uint64_t key)

{
  file_info **__src;
  int iVar1;
  file_info **ppfVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  iVar1 = heap->allocated;
  if (heap->used < iVar1) {
LAB_00205117:
    file->key = key;
    uVar5 = heap->used;
    heap->used = uVar5 + 1;
    uVar3 = (ulong)uVar5;
    if (0 < (int)uVar5) {
      do {
        uVar5 = (int)uVar3 - 1;
        uVar4 = (ulong)(uVar5 >> 1);
        ppfVar2 = heap->files;
        if (ppfVar2[uVar4]->key <= key) {
          ppfVar2[uVar3] = file;
          goto LAB_00205172;
        }
        ppfVar2[uVar3] = ppfVar2[uVar4];
        uVar3 = uVar4;
      } while (1 < uVar5);
    }
    *heap->files = file;
LAB_00205172:
    iVar1 = 0;
  }
  else {
    iVar6 = iVar1 * 2;
    if (iVar1 < 0x400) {
      iVar6 = 0x400;
    }
    if (iVar1 < iVar6) {
      ppfVar2 = (file_info **)malloc((long)iVar6 << 3);
      if (ppfVar2 != (file_info **)0x0) {
        __src = heap->files;
        memcpy(ppfVar2,__src,(long)iVar1 << 3);
        if (__src != (file_info **)0x0) {
          free(__src);
        }
        heap->files = ppfVar2;
        heap->allocated = iVar6;
        goto LAB_00205117;
      }
    }
    archive_set_error(&a->archive,0xc,"Out of memory");
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

static int
heap_add_entry(struct archive_read *a, struct heap_queue *heap,
    struct file_info *file, uint64_t key)
{
	uint64_t file_key, parent_key;
	int hole, parent;

	/* Expand our pending files list as necessary. */
	if (heap->used >= heap->allocated) {
		struct file_info **new_pending_files;
		int new_size = heap->allocated * 2;

		if (heap->allocated < 1024)
			new_size = 1024;
		/* Overflow might keep us from growing the list. */
		if (new_size <= heap->allocated) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		new_pending_files = (struct file_info **)
		    malloc(new_size * sizeof(new_pending_files[0]));
		if (new_pending_files == NULL) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(new_pending_files, heap->files,
		    heap->allocated * sizeof(new_pending_files[0]));
		if (heap->files != NULL)
			free(heap->files);
		heap->files = new_pending_files;
		heap->allocated = new_size;
	}

	file_key = file->key = key;

	/*
	 * Start with hole at end, walk it up tree to find insertion point.
	 */
	hole = heap->used++;
	while (hole > 0) {
		parent = (hole - 1)/2;
		parent_key = heap->files[parent]->key;
		if (file_key >= parent_key) {
			heap->files[hole] = file;
			return (ARCHIVE_OK);
		}
		/* Move parent into hole <==> move hole up tree. */
		heap->files[hole] = heap->files[parent];
		hole = parent;
	}
	heap->files[0] = file;

	return (ARCHIVE_OK);
}